

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O2

void duckdb::ArrayGenericFold<double,duckdb::NegativeInnerProductOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  data_ptr_t pdVar1;
  bool bVar2;
  BoundFunctionExpression *pBVar3;
  reference pvVar4;
  Vector *vector;
  Vector *vector_00;
  idx_t count_00;
  InvalidInputException *pIVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  idx_t iVar6;
  idx_t idx;
  idx_t iVar7;
  double dVar8;
  allocator local_191;
  Vector *local_190;
  Vector *local_188;
  Vector *local_180;
  string *local_178;
  data_ptr_t local_170;
  data_ptr_t local_168;
  string local_160;
  string local_140;
  string local_120 [32];
  string local_100;
  string local_e0 [32];
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  
  local_190 = result;
  pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  count = args->count;
  pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vector = ArrayVector::GetEntry(pvVar4);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  vector_00 = ArrayVector::GetEntry(pvVar4);
  local_180 = vector;
  FlatVector::VerifyFlatVector(vector);
  local_188 = vector_00;
  FlatVector::VerifyFlatVector(vector_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&lhs_format);
  UnifiedVectorFormat::UnifiedVectorFormat(&rhs_format);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  Vector::ToUnifiedFormat(pvVar4,count,&lhs_format);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  Vector::ToUnifiedFormat(pvVar4,count,&rhs_format);
  local_168 = local_180->data;
  local_170 = local_188->data;
  pdVar1 = local_190->data;
  pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  count_00 = ArrayType::GetSize(&pvVar4->type);
  local_178 = (string *)
              &(pBVar3->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
  local_180 = (Vector *)&local_180->validity;
  local_188 = (Vector *)&local_188->validity;
  idx = 0;
  do {
    if (count == idx) {
      if (count == 1) {
        Vector::SetVectorType(local_190,CONSTANT_VECTOR);
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&rhs_format);
      UnifiedVectorFormat::~UnifiedVectorFormat(&lhs_format);
      return;
    }
    iVar6 = idx;
    if ((lhs_format.sel)->sel_vector != (sel_t *)0x0) {
      iVar6 = (idx_t)(lhs_format.sel)->sel_vector[idx];
    }
    iVar7 = idx;
    if ((rhs_format.sel)->sel_vector != (sel_t *)0x0) {
      iVar7 = (idx_t)(rhs_format.sel)->sel_vector[idx];
    }
    if (((lhs_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) ||
        (in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(iVar6 >> 6),
        (lhs_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[(long)in_RCX]
         >> (iVar6 & 0x3f) & 1) != 0)) &&
       ((rhs_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0 ||
        (in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(iVar7 >> 6),
        (rhs_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[(long)in_RCX]
         >> (iVar7 & 0x3f) & 1) != 0)))) {
      iVar6 = iVar6 * count_00;
      bVar2 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                        ((TemplatedValidityMask<unsigned_long> *)local_180,iVar6 + count_00,iVar6);
      if (!bVar2) {
        pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  (local_e0,"%s: left argument can not contain NULL values",&local_191);
        ::std::__cxx11::string::string((string *)&local_100,local_178);
        StringUtil::Format<std::__cxx11::string>
                  (&local_160,(StringUtil *)local_e0,&local_100,in_RCX);
        InvalidInputException::InvalidInputException(pIVar5,(string *)&local_160);
        __cxa_throw(pIVar5,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar7 = iVar7 * count_00;
      bVar2 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                        ((TemplatedValidityMask<unsigned_long> *)local_188,iVar7 + count_00,iVar7);
      if (!bVar2) {
        pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  (local_120,"%s: right argument can not contain NULL values",&local_191);
        ::std::__cxx11::string::string((string *)&local_140,local_178);
        StringUtil::Format<std::__cxx11::string>
                  (&local_160,(StringUtil *)local_120,&local_140,in_RCX);
        InvalidInputException::InvalidInputException(pIVar5,(string *)&local_160);
        __cxa_throw(pIVar5,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      dVar8 = NegativeInnerProductOp::Operation<double>
                        ((double *)(local_168 + iVar6 * 8),(double *)(local_170 + iVar7 * 8),
                         count_00);
      *(double *)(pdVar1 + idx * 8) = dVar8;
    }
    else {
      FlatVector::SetNull(local_190,idx,true);
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

static void ArrayGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(result);

	const auto array_size = ArrayType::GetSize(args.data[0].GetType());
	D_ASSERT(array_size == ArrayType::GetSize(args.data[1].GetType()));

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * array_size;
		if (!lhs_child_validity.CheckAllValid(left_offset + array_size, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * array_size;
		if (!rhs_child_validity.CheckAllValid(right_offset + array_size, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;

		res_data[i] = OP::Operation(lhs_data_ptr, rhs_data_ptr, array_size);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}